

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,TestContext *testCtx,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  DataType DVar4;
  pointer pcVar5;
  float fVar6;
  DataType DVar7;
  float fVar8;
  float fVar9;
  DataType DVar10;
  float fVar11;
  float fVar12;
  DataType DVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  ShaderEvaluator *this_00;
  char *pcVar18;
  ostream *poVar19;
  size_t sVar20;
  ShaderValue *pSVar21;
  string *psVar22;
  int precision;
  char *pcVar23;
  undefined1 *puVar24;
  Precision PVar25;
  string *this_01;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  string header;
  string prefix;
  char *inputPrecision [3];
  size_type __dnew;
  ostringstream vtx;
  ostringstream frag;
  char *local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540 [2];
  string local_530;
  string local_510;
  long *local_4f0;
  long local_4e8;
  long local_4e0 [2];
  string *local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c8;
  ShaderValue *local_4c0;
  undefined8 auStack_4b8 [4];
  string local_498 [3];
  ios_base local_428 [264];
  string local_320 [3];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_498,caseName,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_320,description,(allocator<char> *)&local_550);
  this_00 = (ShaderEvaluator *)operator_new(0x28);
  fVar2 = spec->referenceScale;
  fVar3 = spec->referenceBias;
  iVar16 = glu::getDataTypeScalarSize(spec->output);
  ShaderEvaluator::ShaderEvaluator(this_00);
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00d5ba30;
  this_00[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  *(int *)&this_00[1].m_evalFunc = iVar16;
  *(float *)((long)&this_00[1].m_evalFunc + 4) = fVar2;
  *(float *)&this_00[2]._vptr_ShaderEvaluator = fVar3;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,local_498,local_320,isVertexCase,this_00,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00d5b9d0;
  fVar2 = spec->resultBias;
  fVar3 = spec->referenceScale;
  fVar6 = spec->referenceBias;
  PVar25 = spec->precision;
  DVar4 = spec->output;
  iVar16 = spec->numInputs;
  DVar7 = spec->inputs[0].type;
  fVar8 = spec->inputs[0].rangeMin;
  fVar9 = spec->inputs[0].rangeMax;
  DVar10 = spec->inputs[1].type;
  fVar11 = spec->inputs[1].rangeMin;
  fVar12 = spec->inputs[1].rangeMax;
  DVar13 = spec->inputs[2].type;
  fVar14 = spec->inputs[2].rangeMin;
  fVar15 = spec->inputs[2].rangeMax;
  (this->m_spec).resultScale = spec->resultScale;
  (this->m_spec).resultBias = fVar2;
  (this->m_spec).referenceScale = fVar3;
  (this->m_spec).referenceBias = fVar6;
  (this->m_spec).precision = PVar25;
  (this->m_spec).output = DVar4;
  (this->m_spec).numInputs = iVar16;
  (this->m_spec).inputs[0].type = DVar7;
  (this->m_spec).inputs[0].rangeMin = fVar8;
  (this->m_spec).inputs[0].rangeMax = fVar9;
  (this->m_spec).inputs[1].type = DVar10;
  (this->m_spec).inputs[1].rangeMin = fVar11;
  (this->m_spec).inputs[1].rangeMax = fVar12;
  (this->m_spec).inputs[2].type = DVar13;
  (this->m_spec).inputs[2].rangeMin = fVar14;
  (this->m_spec).inputs[2].rangeMax = fVar15;
  local_4d0 = &this->m_shaderOp;
  local_4c8 = &(this->m_shaderOp).field_2;
  (this->m_shaderOp)._M_dataplus._M_p = (pointer)local_4c8;
  pcVar5 = (shaderOp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar5,pcVar5 + shaderOp->_M_string_length);
  PVar25 = (this->m_spec).precision;
  if (PVar25 == PRECISION_LAST) {
    local_558 = (char *)0x0;
  }
  else {
    local_558 = glu::getPrecisionName(PVar25);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_01 = local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    this_01 = local_320;
  }
  local_550 = local_540;
  local_498[0]._M_dataplus._M_p = (pointer)0x10;
  local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)local_498);
  local_540[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_498[0]._M_dataplus._M_p;
  *local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6e6f697372657623;
  local_550[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xa73652030313320;
  local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p;
  *(char *)((long)local_550 + (long)local_498[0]._M_dataplus._M_p) = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_550,(long)local_498[0]._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_550,(long)local_548);
  if (0 < (this->m_spec).numInputs) {
    pSVar21 = (this->m_spec).inputs;
    lVar26 = 0;
    do {
      PVar25 = PRECISION_HIGHP;
      if (7 < pSVar21->type - TYPE_INT) {
        PVar25 = (this->m_spec).precision;
      }
      if (pSVar21->type - TYPE_BOOL < 4) {
        PVar25 = PRECISION_MEDIUMP;
      }
      pcVar18 = glu::getPrecisionName(PVar25);
      auStack_4b8[lVar26] = pcVar18;
      lVar26 = lVar26 + 1;
      pSVar21 = pSVar21 + 1;
    } while (lVar26 < (this->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  if (0 < (this->m_spec).numInputs) {
    lVar26 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(location = ",0x12);
      poVar19 = (ostream *)std::ostream::operator<<(local_320,(int)lVar26 + 4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,") in ",5);
      pcVar18 = (char *)auStack_4b8[lVar26];
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)poVar19 + (int)*(undefined8 *)(*(long *)poVar19 + -0x18));
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," vec4 a_in",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)lVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
      lVar26 = lVar26 + 1;
    } while (lVar26 < (this->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar26 = 0;
    while (lVar26 < (this->m_spec).numInputs) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(location = ",0x12);
      iVar16 = (int)(lVar26 + 1);
      poVar19 = (ostream *)std::ostream::operator<<(local_320,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,") out ",6);
      pcVar18 = (char *)auStack_4b8[lVar26];
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)poVar19 + (int)*(undefined8 *)(*(long *)poVar19 + -0x18));
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," vec4 v_in",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)lVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = ",0x12);
      poVar19 = (ostream *)std::ostream::operator<<(local_1a8,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,") in ",5);
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)poVar19 + (int)*(undefined8 *)(*(long *)poVar19 + -0x18));
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," vec4 v_in",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar16 + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
      lVar26 = lVar26 + 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in mediump vec4 v_color;\n",0x2e);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  pcVar18 = "v_";
  bVar28 = (this->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar28) {
    pcVar18 = "a_";
  }
  local_4f0 = local_4e0;
  pcVar23 = "";
  if (bVar28) {
    pcVar23 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,pcVar18,pcVar23);
  iVar16 = (int)this_01;
  if (0 < (this->m_spec).numInputs) {
    pSVar21 = (this->m_spec).inputs;
    puVar24 = sr::(anonymous_namespace)::s_inSwizzles;
    lVar26 = 0;
    do {
      DVar4 = pSVar21->type;
      local_4c0 = pSVar21;
      iVar17 = glu::getDataTypeScalarSize(DVar4);
      pcVar23 = glu::getDataTypeName(DVar4);
      pcVar18 = *(char **)(puVar24 + (long)(iVar17 + -1) * 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
      uVar1 = DVar4 - TYPE_BOOL;
      if (local_558 != (char *)0x0 && 3 < uVar1) {
        sVar20 = strlen(local_558);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_558,sVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
      }
      if (pcVar23 == (char *)0x0) {
        std::ios::clear(iVar16 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
      }
      else {
        sVar20 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar23,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," in",3);
      poVar19 = (ostream *)std::ostream::operator<<(this_01,(int)lVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," = ",3);
      if (uVar1 < 4) {
        pcVar23 = "greaterThan(";
        if (iVar17 == 1) {
          pcVar23 = "(";
        }
        lVar27 = 0xc;
        if (iVar17 == 1) {
          lVar27 = 1;
        }
LAB_0060be5d:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar23,lVar27);
      }
      else if (DVar4 - TYPE_INT < 8) {
        if (pcVar23 == (char *)0x0) {
          lVar27 = 1;
          std::ios::clear(iVar16 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
          pcVar23 = "(";
        }
        else {
          sVar20 = strlen(pcVar23);
          lVar27 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar23,sVar20);
          pcVar23 = "(";
        }
        goto LAB_0060be5d;
      }
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,(char *)local_4f0,local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"in",2);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)lVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)poVar19 + (int)*(undefined8 *)(*(long *)poVar19 + -0x18));
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,sVar20);
      }
      psVar22 = this_01;
      if (uVar1 < 4) {
        lVar27 = 7;
        pcVar18 = " > 0.0)";
        if (iVar17 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", vec",5);
          psVar22 = (string *)std::ostream::operator<<(this_01,iVar17);
          lVar27 = 6;
          pcVar18 = "(0.0))";
        }
LAB_0060bf63:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar22,pcVar18,lVar27);
      }
      else {
        lVar27 = 1;
        pcVar18 = ")";
        if (DVar4 - TYPE_INT < 8) goto LAB_0060bf63;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
      lVar26 = lVar26 + 1;
      puVar24 = puVar24 + 0x20;
      pSVar21 = local_4c0 + 1;
    } while (lVar26 < (this->m_spec).numInputs);
  }
  pcVar18 = glu::getDataTypeName((this->m_spec).output);
  DVar4 = (this->m_spec).output;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
  if ((local_558 != (char *)0x0) && (3 < DVar4 - TYPE_BOOL)) {
    sVar20 = strlen(local_558);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_558,sVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
  }
  if (pcVar18 == (char *)0x0) {
    std::ios::clear(iVar16 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
  }
  else {
    sVar20 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," res = ",7);
  if (pcVar18 == (char *)0x0) {
    std::ios::clear(iVar16 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
  }
  else {
    sVar20 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(0.0);\n\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,(this->m_shaderOp)._M_dataplus._M_p,
                       (this->m_shaderOp)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n\n",2);
  DVar4 = (this->m_spec).output;
  iVar16 = glu::getDataTypeScalarSize(DVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tcolor.",7);
  lVar26 = (long)(iVar16 + -1);
  pcVar18 = *(char **)(sr::(anonymous_namespace)::s_outSwizzles + lVar26 * 8);
  sVar20 = strlen(pcVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," = ",3);
  bVar28 = 3 < DVar4 - TYPE_FLOAT;
  bVar29 = iVar16 != 1;
  pcVar18 = "float(res)";
  if (bVar29 || !bVar28) {
    pcVar18 = "res";
  }
  lVar27 = 10;
  if (bVar29 || !bVar28) {
    lVar27 = 3;
  }
  psVar22 = this_01;
  if (bVar29 && bVar28) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"vec",3);
    psVar22 = (string *)std::ostream::operator<<(this_01,iVar16);
    lVar27 = 5;
    pcVar18 = "(res)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar22,pcVar18,lVar27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  fVar2 = (this->m_spec).resultScale;
  fVar3 = (this->m_spec).resultBias;
  if ((((fVar2 != 1.0) || (NAN(fVar2))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tcolor = color",0xe);
    if ((fVar2 != 1.0) || (NAN(fVar2))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," * ",3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::_M_insert<double>((double)fVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      local_498[0].field_2._M_allocated_capacity._0_4_ = 0x302e31;
      local_498[0]._M_string_length = 3;
      twoValuedVec4(&local_530,&local_510,local_498,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar26 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_530._M_dataplus._M_p,local_530._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT44(local_510.field_2._M_allocated_capacity._4_4_,
                                 local_510.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," + ",3);
      de::floatToString_abi_cxx11_(&local_530,(de *)0x2,fVar3,precision);
      local_510.field_2._M_allocated_capacity._0_4_ = 0x302e30;
      local_510._M_string_length = 3;
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      twoValuedVec4(local_498,&local_530,&local_510,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar26 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_498[0]._M_dataplus._M_p,local_498[0]._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT44(local_510.field_2._M_allocated_capacity._4_4_,
                                 local_510.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  }
  if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar26 = 0x12;
    pcVar18 = "\to_color = color;\n";
    if (0 < (this->m_spec).numInputs) {
      iVar16 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
        poVar19 = (ostream *)std::ostream::operator<<(local_320,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," = a_in",7);
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
        iVar16 = iVar16 + 1;
      } while (iVar16 < (this->m_spec).numInputs);
      lVar26 = 0x12;
      pcVar18 = "\to_color = color;\n";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = color;\n",0x12);
    lVar26 = 0x14;
    pcVar18 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0,local_4e0[0] + 1);
  }
  if (local_550 != local_540) {
    operator_delete(local_550,(ulong)(local_540[0]->_M_local_buf + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (tcu::TestContext&		testCtx,
										const char*				caseName,
										const char*				description,
										const bool				isVertexCase,
										const ShaderEvalFunc	evalFunc,
										const std::string&		shaderOp,
										const ShaderDataSpec&	spec)
	: ShaderRenderCase	(testCtx,
						 caseName,
						 description,
						 isVertexCase,
						 new OperatorShaderEvaluator(evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output)),
						 DE_NULL,
						 DE_NULL)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
{
	setupShaderData();
}